

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

wostream * Centaurus::operator<<(wostream *os,PriorityChain *chain)

{
  ulong uVar1;
  long lVar2;
  pointer pPVar3;
  ulong uVar4;
  wchar_t local_3c [3];
  
  local_3c[1] = 0x7b;
  uVar4 = 1;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c + 1,1);
  pPVar3 = (chain->
           super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
           ).
           super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(chain->
                         super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                         ).
                         super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4) *
                 -0x5555555555555555)) {
    lVar2 = 0;
    do {
      operator<<(os,(PriorityChainElement *)((long)&(pPVar3->m_id)._vptr_Identifier + lVar2));
      local_3c[0] = L'>';
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c,1);
      uVar4 = uVar4 + 1;
      pPVar3 = (chain->
               super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               ).
               super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(chain->
                     super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                     ).
                     super__Vector_base<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 4) *
              -0x5555555555555555;
      lVar2 = lVar2 + 0x30;
    } while (uVar4 <= uVar1 && uVar1 - uVar4 != 0);
  }
  local_3c[2] = 0x7d;
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c + 2,1);
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChain& chain)
{
    os << L'{';
    for (int i = 0; i + 1 < chain.size(); i++)
    {
        os << chain[i] << L'>';
    }
    os << L'}';
    return os;
}